

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_nullddi.cpp
# Opt level: O1

ze_result_t driver::zeRTASBuilderDestroyExt(ze_rtas_builder_ext_handle_t hBuilder)

{
  ze_result_t zVar1;
  
  if (DAT_0010e0f8 != (code *)0x0) {
    zVar1 = (*DAT_0010e0f8)();
    return zVar1;
  }
  return ZE_RESULT_SUCCESS;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zeRTASBuilderDestroyExt(
        ze_rtas_builder_ext_handle_t hBuilder           ///< [in][release] handle of builder object to destroy
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // if the driver has created a custom function, then call it instead of using the generic path
        auto pfnDestroyExt = context.zeDdiTable.RTASBuilder.pfnDestroyExt;
        if( nullptr != pfnDestroyExt )
        {
            result = pfnDestroyExt( hBuilder );
        }
        else
        {
            // generic implementation

        }

        return result;
    }